

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O2

void png_write_info(png_structrp png_ptr,png_const_inforp info_ptr)

{
  byte *pbVar1;
  int compression;
  uint uVar2;
  png_textp ppVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  if (info_ptr == (png_const_inforp)0x0 || png_ptr == (png_structrp)0x0) {
    return;
  }
  png_write_info_before_PLTE(png_ptr,info_ptr);
  uVar2 = info_ptr->valid;
  if ((uVar2 & 8) == 0) {
    if (info_ptr->color_type == '\x03') {
      png_error(png_ptr,"Valid palette required for paletted images");
    }
  }
  else {
    png_write_PLTE(png_ptr,info_ptr->palette,(uint)info_ptr->num_palette);
    uVar2 = info_ptr->valid;
  }
  if ((uVar2 & 0x10) != 0) {
    if (((png_ptr->transformations & 0x80000) != 0) && (info_ptr->color_type == '\x03')) {
      uVar2 = 0x100;
      if (info_ptr->num_trans < 0x100) {
        uVar2 = (uint)info_ptr->num_trans;
      }
      for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        info_ptr->trans_alpha[uVar4] = ~info_ptr->trans_alpha[uVar4];
      }
    }
    png_write_tRNS(png_ptr,info_ptr->trans_alpha,&info_ptr->trans_color,(uint)info_ptr->num_trans,
                   (uint)info_ptr->color_type);
    uVar2 = info_ptr->valid;
  }
  if ((uVar2 & 0x20) != 0) {
    png_write_bKGD(png_ptr,&info_ptr->background,(uint)info_ptr->color_type);
    uVar2 = info_ptr->valid;
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    png_write_eXIf(png_ptr,info_ptr->exif,info_ptr->num_exif);
    uVar2 = info_ptr->valid;
  }
  if ((uVar2 & 0x40) != 0) {
    png_write_hIST(png_ptr,info_ptr->hist,(uint)info_ptr->num_palette);
    uVar2 = info_ptr->valid;
  }
  if ((uVar2 >> 8 & 1) != 0) {
    png_write_oFFs(png_ptr,info_ptr->x_offset,info_ptr->y_offset,(uint)info_ptr->offset_unit_type);
    uVar2 = info_ptr->valid;
  }
  if ((uVar2 >> 10 & 1) != 0) {
    png_write_pCAL(png_ptr,info_ptr->pcal_purpose,info_ptr->pcal_X0,info_ptr->pcal_X1,
                   (uint)info_ptr->pcal_type,(uint)info_ptr->pcal_nparams,info_ptr->pcal_units,
                   info_ptr->pcal_params);
    uVar2 = info_ptr->valid;
  }
  if ((uVar2 >> 0xe & 1) != 0) {
    png_write_sCAL_s(png_ptr,(uint)info_ptr->scal_unit,info_ptr->scal_s_width,
                     info_ptr->scal_s_height);
    uVar2 = info_ptr->valid;
  }
  if ((char)uVar2 < '\0') {
    png_write_pHYs(png_ptr,info_ptr->x_pixels_per_unit,info_ptr->y_pixels_per_unit,
                   (uint)info_ptr->phys_unit_type);
    uVar2 = info_ptr->valid;
  }
  if ((uVar2 >> 9 & 1) != 0) {
    png_write_tIME(png_ptr,&info_ptr->mod_time);
    pbVar1 = (byte *)((long)&png_ptr->mode + 1);
    *pbVar1 = *pbVar1 | 2;
    uVar2 = info_ptr->valid;
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    lVar6 = 0;
    for (lVar5 = 0; lVar5 < info_ptr->splt_palettes_num; lVar5 = lVar5 + 1) {
      png_write_sPLT(png_ptr,(png_const_sPLT_tp)((long)&info_ptr->splt_palettes->name + lVar6));
      lVar6 = lVar6 + 0x20;
    }
  }
  lVar6 = 0;
  lVar5 = 0;
  do {
    if (info_ptr->num_text <= lVar5) {
      write_unknown_chunks(png_ptr,info_ptr,2);
      return;
    }
    ppVar3 = info_ptr->text;
    compression = *(int *)((long)&ppVar3->compression + lVar6);
    if (compression < 1) {
      if (compression == -1) {
        png_write_tEXt(png_ptr,*(png_const_charp *)((long)&ppVar3->key + lVar6),
                       *(png_const_charp *)((long)&ppVar3->text + lVar6),0);
        ppVar3 = info_ptr->text;
        goto LAB_0011cc19;
      }
      if (compression == 0) {
        png_write_zTXt(png_ptr,*(png_const_charp *)((long)&ppVar3->key + lVar6),
                       *(png_const_charp *)((long)&ppVar3->text + lVar6),0);
        ppVar3 = info_ptr->text;
        goto LAB_0011cbf4;
      }
    }
    else {
      png_write_iTXt(png_ptr,compression,*(png_const_charp *)((long)&ppVar3->key + lVar6),
                     *(png_const_charp *)((long)&ppVar3->lang + lVar6),
                     *(png_const_charp *)((long)&ppVar3->lang_key + lVar6),
                     *(png_const_charp *)((long)&ppVar3->text + lVar6));
      ppVar3 = info_ptr->text;
      if (*(int *)((long)&ppVar3->compression + lVar6) == -1) {
LAB_0011cc19:
        *(undefined4 *)((long)&ppVar3->compression + lVar6) = 0xfffffffd;
      }
      else {
LAB_0011cbf4:
        *(undefined4 *)((long)&ppVar3->compression + lVar6) = 0xfffffffe;
      }
    }
    lVar5 = lVar5 + 1;
    lVar6 = lVar6 + 0x38;
  } while( true );
}

Assistant:

void PNGAPI
png_write_info(png_structrp png_ptr, png_const_inforp info_ptr)
{
#if defined(PNG_WRITE_TEXT_SUPPORTED) || defined(PNG_WRITE_sPLT_SUPPORTED)
   int i;
#endif

   png_debug(1, "in png_write_info");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

   png_write_info_before_PLTE(png_ptr, info_ptr);

   if ((info_ptr->valid & PNG_INFO_PLTE) != 0)
      png_write_PLTE(png_ptr, info_ptr->palette,
          (png_uint_32)info_ptr->num_palette);

   else if (info_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
      png_error(png_ptr, "Valid palette required for paletted images");

#ifdef PNG_WRITE_tRNS_SUPPORTED
   if ((info_ptr->valid & PNG_INFO_tRNS) !=0)
   {
#ifdef PNG_WRITE_INVERT_ALPHA_SUPPORTED
      /* Invert the alpha channel (in tRNS) */
      if ((png_ptr->transformations & PNG_INVERT_ALPHA) != 0 &&
          info_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
      {
         int j, jend;

         jend = info_ptr->num_trans;
         if (jend > PNG_MAX_PALETTE_LENGTH)
            jend = PNG_MAX_PALETTE_LENGTH;

         for (j = 0; j<jend; ++j)
            info_ptr->trans_alpha[j] =
               (png_byte)(255 - info_ptr->trans_alpha[j]);
      }
#endif
      png_write_tRNS(png_ptr, info_ptr->trans_alpha, &(info_ptr->trans_color),
          info_ptr->num_trans, info_ptr->color_type);
   }
#endif
#ifdef PNG_WRITE_bKGD_SUPPORTED
   if ((info_ptr->valid & PNG_INFO_bKGD) != 0)
      png_write_bKGD(png_ptr, &(info_ptr->background), info_ptr->color_type);
#endif

#ifdef PNG_WRITE_eXIf_SUPPORTED
   if ((info_ptr->valid & PNG_INFO_eXIf) != 0)
      png_write_eXIf(png_ptr, info_ptr->exif, info_ptr->num_exif);
#endif

#ifdef PNG_WRITE_hIST_SUPPORTED
   if ((info_ptr->valid & PNG_INFO_hIST) != 0)
      png_write_hIST(png_ptr, info_ptr->hist, info_ptr->num_palette);
#endif

#ifdef PNG_WRITE_oFFs_SUPPORTED
   if ((info_ptr->valid & PNG_INFO_oFFs) != 0)
      png_write_oFFs(png_ptr, info_ptr->x_offset, info_ptr->y_offset,
          info_ptr->offset_unit_type);
#endif

#ifdef PNG_WRITE_pCAL_SUPPORTED
   if ((info_ptr->valid & PNG_INFO_pCAL) != 0)
      png_write_pCAL(png_ptr, info_ptr->pcal_purpose, info_ptr->pcal_X0,
          info_ptr->pcal_X1, info_ptr->pcal_type, info_ptr->pcal_nparams,
          info_ptr->pcal_units, info_ptr->pcal_params);
#endif

#ifdef PNG_WRITE_sCAL_SUPPORTED
   if ((info_ptr->valid & PNG_INFO_sCAL) != 0)
      png_write_sCAL_s(png_ptr, (int)info_ptr->scal_unit,
          info_ptr->scal_s_width, info_ptr->scal_s_height);
#endif /* sCAL */

#ifdef PNG_WRITE_pHYs_SUPPORTED
   if ((info_ptr->valid & PNG_INFO_pHYs) != 0)
      png_write_pHYs(png_ptr, info_ptr->x_pixels_per_unit,
          info_ptr->y_pixels_per_unit, info_ptr->phys_unit_type);
#endif /* pHYs */

#ifdef PNG_WRITE_tIME_SUPPORTED
   if ((info_ptr->valid & PNG_INFO_tIME) != 0)
   {
      png_write_tIME(png_ptr, &(info_ptr->mod_time));
      png_ptr->mode |= PNG_WROTE_tIME;
   }
#endif /* tIME */

#ifdef PNG_WRITE_sPLT_SUPPORTED
   if ((info_ptr->valid & PNG_INFO_sPLT) != 0)
      for (i = 0; i < (int)info_ptr->splt_palettes_num; i++)
         png_write_sPLT(png_ptr, info_ptr->splt_palettes + i);
#endif /* sPLT */

#ifdef PNG_WRITE_TEXT_SUPPORTED
   /* Check to see if we need to write text chunks */
   for (i = 0; i < info_ptr->num_text; i++)
   {
      png_debug2(2, "Writing header text chunk %d, type %d", i,
          info_ptr->text[i].compression);
      /* An internationalized chunk? */
      if (info_ptr->text[i].compression > 0)
      {
#ifdef PNG_WRITE_iTXt_SUPPORTED
         /* Write international chunk */
         png_write_iTXt(png_ptr,
             info_ptr->text[i].compression,
             info_ptr->text[i].key,
             info_ptr->text[i].lang,
             info_ptr->text[i].lang_key,
             info_ptr->text[i].text);
         /* Mark this chunk as written */
         if (info_ptr->text[i].compression == PNG_TEXT_COMPRESSION_NONE)
            info_ptr->text[i].compression = PNG_TEXT_COMPRESSION_NONE_WR;
         else
            info_ptr->text[i].compression = PNG_TEXT_COMPRESSION_zTXt_WR;
#else
         png_warning(png_ptr, "Unable to write international text");
#endif
      }

      /* If we want a compressed text chunk */
      else if (info_ptr->text[i].compression == PNG_TEXT_COMPRESSION_zTXt)
      {
#ifdef PNG_WRITE_zTXt_SUPPORTED
         /* Write compressed chunk */
         png_write_zTXt(png_ptr, info_ptr->text[i].key,
             info_ptr->text[i].text, info_ptr->text[i].compression);
         /* Mark this chunk as written */
         info_ptr->text[i].compression = PNG_TEXT_COMPRESSION_zTXt_WR;
#else
         png_warning(png_ptr, "Unable to write compressed text");
#endif
      }

      else if (info_ptr->text[i].compression == PNG_TEXT_COMPRESSION_NONE)
      {
#ifdef PNG_WRITE_tEXt_SUPPORTED
         /* Write uncompressed chunk */
         png_write_tEXt(png_ptr, info_ptr->text[i].key,
             info_ptr->text[i].text,
             0);
         /* Mark this chunk as written */
         info_ptr->text[i].compression = PNG_TEXT_COMPRESSION_NONE_WR;
#else
         /* Can't get here */
         png_warning(png_ptr, "Unable to write uncompressed text");
#endif
      }
   }
#endif /* tEXt */

#ifdef PNG_WRITE_UNKNOWN_CHUNKS_SUPPORTED
   write_unknown_chunks(png_ptr, info_ptr, PNG_HAVE_PLTE);
#endif
}